

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_server.cpp
# Opt level: O3

void __thiscall
miniros::ServiceServer::ServiceServer(ServiceServer *this,string *service,NodeHandle *node_handle)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  NodeHandle *pNVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_39;
  NodeHandle *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (this->impl_).super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::ServiceServer::Impl,std::allocator<miniros::ServiceServer::Impl>>
            (&(this->impl_).
              super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Impl **)this,(allocator<miniros::ServiceServer::Impl> *)&local_38);
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_).
             super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::NodeHandle,std::allocator<miniros::NodeHandle>,miniros::NodeHandle_const&>
            (a_Stack_30,&local_38,(allocator<miniros::NodeHandle> *)&local_39,node_handle);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  pNVar2 = local_38;
  peVar1 = (this->impl_).
           super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (NodeHandle *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (peVar1->node_handle_).
            super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (peVar1->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pNVar2;
  (peVar1->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  return;
}

Assistant:

ServiceServer::ServiceServer(const std::string& service, const NodeHandle& node_handle)
: impl_(std::make_shared<Impl>())
{
  impl_->service_ = service;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
}